

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRViewportNode.cpp
# Opt level: O0

void __thiscall
MinVR::VRViewportNode::render
          (VRViewportNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  VRDataIndex *in_RSI;
  long in_RDI;
  float fVar1;
  float fVar2;
  VRRect *in_stack_fffffffffffffe18;
  VRRect *this_00;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  VRDataIndex *pVVar3;
  allocator<char> *in_stack_fffffffffffffe50;
  VRDataIndex *__a;
  char *in_stack_fffffffffffffe58;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  VRInt VVar4;
  string *in_stack_fffffffffffffe70;
  string *key;
  undefined4 in_stack_fffffffffffffe78;
  undefined1 local_168 [39];
  undefined1 local_141 [33];
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [39];
  undefined1 local_b1 [33];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [40];
  VRDataIndex *local_10;
  
  VVar4 = (VRInt)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  local_10 = in_RSI;
  VRDataIndex::pushState
            ((VRDataIndex *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),in_stack_fffffffffffffe58
             ,in_stack_fffffffffffffe50);
  fVar1 = VRRect::getX((VRRect *)(in_RDI + 0x70));
  VRDataIndex::addData
            ((VRDataIndex *)CONCAT44(fVar1,in_stack_fffffffffffffe78),in_stack_fffffffffffffe70,
             VVar4);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  key = (string *)local_b1;
  pVVar3 = local_10;
  std::allocator<char>::allocator();
  VVar4 = (VRInt)((ulong)pVVar3 >> 0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),in_stack_fffffffffffffe58
             ,in_stack_fffffffffffffe50);
  fVar2 = VRRect::getY((VRRect *)(in_RDI + 0x70));
  VRDataIndex::addData((VRDataIndex *)CONCAT44(fVar1,in_stack_fffffffffffffe78),key,VVar4);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  __s = &local_f9;
  __a = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(fVar2,in_stack_fffffffffffffe60),(char *)__s,(allocator<char> *)__a);
  VRRect::getWidth((VRRect *)(in_RDI + 0x70));
  VRDataIndex::addData((VRDataIndex *)CONCAT44(fVar1,in_stack_fffffffffffffe78),key,VVar4);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pVVar3 = (VRDataIndex *)local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(fVar2,in_stack_fffffffffffffe60),(char *)__s,(allocator<char> *)__a);
  fVar2 = VRRect::getHeight((VRRect *)(in_RDI + 0x70));
  VRDataIndex::addData((VRDataIndex *)CONCAT44(fVar1,in_stack_fffffffffffffe78),key,VVar4);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string((string *)(local_141 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_141);
  this_00 = *(VRRect **)(in_RDI + 0x90);
  VRRect::VRRect(this_00,in_stack_fffffffffffffe18);
  (*(this_00->super_VRWritable)._vptr_VRWritable[4])(this_00,local_168);
  VRRect::~VRRect((VRRect *)0x17d976);
  VRDisplayNode::render
            ((VRDisplayNode *)pVVar3,local_10,
             (VRRenderHandler *)CONCAT44(fVar2,in_stack_fffffffffffffe30));
  VRDataIndex::popState(pVVar3);
  return;
}

Assistant:

void VRViewportNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler) {
  renderState->pushState();

	// Is this the kind of state information we expect to pass from one node to the next?
	renderState->addData("ViewportX", (int)_rect.getX());
	renderState->addData("ViewportY", (int)_rect.getY());
	renderState->addData("ViewportWidth", (int)_rect.getWidth());
	renderState->addData("ViewportHeight", (int)_rect.getHeight());
  
	_gfxToolkit->setSubWindow(_rect);

	VRDisplayNode::render(renderState, renderHandler);

    renderState->popState();
}